

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOSystem.cpp
# Opt level: O2

string * Assimp::DefaultIOSystem::fileName(string *__return_storage_ptr__,string *path)

{
  long lVar1;
  string local_30 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  lVar1 = std::__cxx11::string::find_last_of((char *)__return_storage_ptr__,0x1cca40);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_30);
    std::__cxx11::string::~string(local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultIOSystem::fileName(const std::string& path)
{
    std::string ret = path;
    std::size_t last = ret.find_last_of("\\/");
    if (last != std::string::npos) ret = ret.substr(last + 1);
    return ret;
}